

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checkqueue.h
# Opt level: O2

void __thiscall
CCheckQueue<FrozenCleanupCheck>::CCheckQueue
          (CCheckQueue<FrozenCleanupCheck> *this,uint batch_size,int worker_threads_num)

{
  int iVar1;
  long in_FS_OFFSET;
  anon_class_16_2_fd512ddb_for__M_head_impl local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined8 *)(this + 0x10) = 0;
  *(undefined8 *)(this + 0x18) = 0;
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  *(undefined8 *)(this + 0x20) = 0;
  std::condition_variable::condition_variable((condition_variable *)(this + 0x28));
  std::condition_variable::condition_variable((condition_variable *)(this + 0x58));
  *(undefined8 *)(this + 0x98) = 0;
  *(undefined8 *)(this + 0xa0) = 0;
  *(undefined8 *)(this + 0x88) = 0;
  *(undefined8 *)(this + 0x90) = 0;
  this[0xa8] = (CCheckQueue<FrozenCleanupCheck>)0x1;
  *(undefined4 *)(this + 0xac) = 0;
  *(uint *)(this + 0xb0) = batch_size;
  *(undefined8 *)(this + 0xd8) = 0;
  *(undefined8 *)(this + 0xe0) = 0;
  *(undefined8 *)(this + 0xf8) = 0;
  *(undefined8 *)(this + 0xe8) = 0;
  *(undefined8 *)(this + 0xf0) = 0;
  *(undefined8 *)(this + 0xb8) = 0;
  *(undefined8 *)(this + 0xc0) = 0;
  *(undefined8 *)(this + 0xc1) = 0;
  *(undefined8 *)(this + 0xc9) = 0;
  std::vector<std::thread,_std::allocator<std::thread>_>::reserve
            ((vector<std::thread,_std::allocator<std::thread>_> *)(this + 0xb8),
             (long)worker_threads_num);
  iVar1 = 0;
  if (worker_threads_num < 1) {
    worker_threads_num = 0;
  }
  for (; worker_threads_num != iVar1; iVar1 = iVar1 + 1) {
    local_48.this = (CCheckQueue<FakeCheckCheckCompletion> *)this;
    local_48.n = iVar1;
    std::vector<std::thread,std::allocator<std::thread>>::
    emplace_back<CCheckQueue<FrozenCleanupCheck>::CCheckQueue(unsigned_int,int)::_lambda()_1_>
              ((vector<std::thread,std::allocator<std::thread>> *)(this + 0xb8),&local_48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

explicit CCheckQueue(unsigned int batch_size, int worker_threads_num)
        : nBatchSize(batch_size)
    {
        m_worker_threads.reserve(worker_threads_num);
        for (int n = 0; n < worker_threads_num; ++n) {
            m_worker_threads.emplace_back([this, n]() {
                util::ThreadRename(strprintf("scriptch.%i", n));
                Loop(false /* worker thread */);
            });
        }
    }